

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::
get_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
          (Attribute *this,
          vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *v)

{
  optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_> ret;
  anon_struct_8_0_00000001_for___align local_48;
  undefined8 local_40;
  long lStack_38;
  optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  local_30;
  
  if (v == (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)0x0) {
    local_30.has_value_ = false;
  }
  else {
    primvar::PrimVar::
    get_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
              (&local_30,&this->_var);
    if (local_30.has_value_ == true) {
      local_48 = local_30.contained.data.__align;
      local_40 = local_30.contained._8_8_;
      lStack_38 = local_30.contained._16_8_;
      local_30.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_30.contained._8_8_ = 0;
      local_30.contained._16_8_ = 0;
      std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
      _M_move_assign(v,&local_48);
      if (local_48 != (anon_struct_8_0_00000001_for___align)0x0) {
        operator_delete((void *)local_48,lStack_38 - (long)local_48);
      }
    }
  }
  return local_30.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }